

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O1

bool __thiscall
QGenericItemModel::removeColumns(QGenericItemModel *this,int column,int count,QModelIndex *parent)

{
  long in_FS_OFFSET;
  bool ret;
  int local_40;
  int local_3c;
  QModelIndex *local_38;
  int *piStack_30;
  int *local_28;
  undefined1 local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &local_3c;
  piStack_30 = &local_40;
  local_11 = 0;
  local_40 = count;
  local_3c = column;
  local_38 = parent;
  (**(code **)(*(long *)(this + 0x10) + 8))(5,*(long *)(this + 0x10),&local_11,&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (bool)local_11;
  }
  __stack_chk_fail();
}

Assistant:

bool QGenericItemModel::removeColumns(int column, int count, const QModelIndex &parent)
{
    return impl->call<bool>(QGenericItemModelImplBase::RemoveColumns, column, count, parent);
}